

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ndicapi.cxx
# Opt level: O2

int ndiGetPHINFPortLocation(ndicapi *pol,char *location)

{
  int i;
  long lVar1;
  
  for (lVar1 = 0; lVar1 != 0xe; lVar1 = lVar1 + 1) {
    location[lVar1] = pol->PhinfPortLocation[lVar1];
  }
  return pol->PhinfUnoccupied;
}

Assistant:

ndicapiExport int ndiGetPHINFPortLocation(ndicapi* pol, char location[14])
{
  char* dp;
  int i;

  dp = pol->PhinfPortLocation;

  for (i = 0; i < 14; i++)
  {
    location[i] = *dp++;
  }

  return pol->PhinfUnoccupied;
}